

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundatanode_inmem.c
# Opt level: O0

SUNErrCode
SUNDataNode_SetData_InMem
          (SUNDataNode self,SUNMemoryType src_mem_type,SUNMemoryType node_mem_type,void *data,
          size_t data_stride,size_t data_bytes)

{
  SUNMemory queue_00;
  SUNMemory *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long in_RDI;
  SUNMemoryHelper in_R8;
  SUNMemory in_R9;
  SUNMemory data_mem_dst;
  SUNMemory data_mem_src;
  void *queue;
  SUNContext_conflict sunctx_local_scope_;
  undefined8 in_stack_ffffffffffffffc0;
  SUNMemory mem;
  SUNMemory src;
  
  src = *(SUNMemory *)(in_RDI + 0x18);
  mem = (SUNMemory)0x0;
  queue_00 = SUNMemoryHelper_Wrap
                       ((SUNMemoryHelper)src,(void *)0x0,
                        (SUNMemoryType)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
  SUNMemoryHelper_AllocStrided
            ((SUNMemoryHelper)CONCAT44(in_ESI,in_EDX),in_RCX,(size_t)in_R8,(size_t)in_R9,
             (SUNMemoryType)((ulong)src >> 0x20),mem);
  SUNMemoryHelper_Copy(in_R8,in_R9,src,(size_t)mem,queue_00);
  SUNMemoryHelper_Dealloc((SUNMemoryHelper)src,mem,queue_00);
  *(undefined8 *)(*(long *)(in_RDI + 0x10) + 0x10) = 0;
  return 0;
}

Assistant:

SUNErrCode SUNDataNode_SetData_InMem(SUNDataNode self, SUNMemoryType src_mem_type,
                                     SUNMemoryType node_mem_type, void* data,
                                     size_t data_stride, size_t data_bytes)
{
  SUNFunctionBegin(self->sunctx);

  /* Use the default queue for the memory helper */
  void* queue = NULL;

  SUNAssert(BASE_MEMBER(self, dtype) == SUNDATANODE_LEAF, SUN_ERR_ARG_WRONGTYPE);

  SUNMemory data_mem_src = SUNMemoryHelper_Wrap(IMPL_MEMBER(self, mem_helper),
                                                data, src_mem_type);
  SUNCheckLastErr();

  SUNMemory data_mem_dst = NULL;
  SUNCheckCall(SUNMemoryHelper_AllocStrided(IMPL_MEMBER(self, mem_helper),
                                            &data_mem_dst, data_bytes,
                                            data_stride, node_mem_type, queue));

  SUNCheckCall(SUNMemoryHelper_Copy(IMPL_MEMBER(self, mem_helper), data_mem_dst,
                                    data_mem_src, data_bytes, queue));

  SUNMemoryHelper_Dealloc(IMPL_MEMBER(self, mem_helper), data_mem_src, queue);

  IMPL_MEMBER(self, leaf_data) = data_mem_dst;

  return SUN_SUCCESS;
}